

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
::~Stack(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
         *this)

{
  void *pvVar1;
  
  for (pvVar1 = *(void **)(this + 0x10); pvVar1 != *(void **)(this + 8);
      pvVar1 = (void *)((long)pvVar1 + -0x40)) {
    Kernel::RationalConstantType::~RationalConstantType
              ((RationalConstantType *)((long)pvVar1 + -0x38));
  }
  if (pvVar1 != (void *)0x0) {
    Lib::free(*(void **)(this + 8));
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }